

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall
capnp::compiler::Compiler::Node::traverse
          (Node *this,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  Node *this_00;
  undefined8 *puVar1;
  undefined8 uVar2;
  mapped_type *pmVar3;
  _Rb_tree_node_base *p_Var4;
  Node **child;
  long lVar5;
  undefined8 *puVar6;
  uint eagerness_00;
  Reader *aux;
  Reader *schemaNode;
  Content *content;
  NullableValue<capnp::schema::Node::Reader> _schema683;
  Maybe<capnp::schema::Node::Reader> local_d8;
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_a0;
  
  _schema683._0_8_ = this;
  pmVar3 = std::__detail::
           _Map_base<capnp::compiler::Compiler::Node_*,_std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::hash<capnp::compiler::Compiler::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<capnp::compiler::Compiler::Node_*,_std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::hash<capnp::compiler::Compiler::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)seen,(key_type *)&_schema683);
  if ((eagerness & ~*pmVar3) != 0) {
    *pmVar3 = *pmVar3 | eagerness;
    getContent((Node *)&_schema683,(State)this);
    uVar2 = _schema683._0_8_;
    if (_schema683._0_8_ != 0) {
      loadFinalSchema(this,finalLoader);
      getFinalSchema(&local_d8,this);
      _schema683.isSet = local_d8.ptr.isSet;
      if (local_d8.ptr.isSet != false) {
        _schema683.field_1._32_8_ = local_d8.ptr.field_1._32_8_;
        _schema683.field_1._40_8_ = local_d8.ptr.field_1._40_8_;
        _schema683.field_1.value._reader.data = local_d8.ptr.field_1.value._reader.data;
        _schema683.field_1.value._reader.pointers = local_d8.ptr.field_1.value._reader.pointers;
        _schema683.field_1.value._reader.segment = local_d8.ptr.field_1.value._reader.segment;
        _schema683.field_1.value._reader.capTable = local_d8.ptr.field_1.value._reader.capTable;
        if (0x7fff < eagerness && local_d8.ptr.isSet == true) {
          eagerness_00 = eagerness & 0xffff8000 | eagerness >> 0xf;
          traverseNodeDependencies
                    (this,&_schema683.field_1.value,eagerness_00,seen,finalLoader,sourceInfo);
          schemaNode = *(Reader **)(uVar2 + 0xd8);
          for (lVar5 = *(long *)(uVar2 + 0xe0) * 0x30; lVar5 != 0; lVar5 = lVar5 + -0x30) {
            traverseNodeDependencies(this,schemaNode,eagerness_00,seen,finalLoader,sourceInfo);
            schemaNode = schemaNode + 1;
          }
        }
      }
      kj::Vector<capnp::schema::Node::SourceInfo::Reader>::
      addAll<kj::Array<capnp::schema::Node::SourceInfo::Reader>&>
                (sourceInfo,(Array<capnp::schema::Node::SourceInfo::Reader> *)(uVar2 + 0xf0));
    }
    if (((eagerness & 2) != 0) && (this_00 = (this->parent).ptr, this_00 != (Node *)0x0)) {
      traverse(this_00,eagerness,seen,finalLoader,sourceInfo);
    }
    if ((eagerness & 4) != 0) {
      getContent((Node *)&_schema683,(State)this);
      uVar2 = _schema683._0_8_;
      if (_schema683._0_8_ != 0) {
        puVar1 = *(undefined8 **)(_schema683._0_8_ + 0x40);
        for (puVar6 = *(undefined8 **)(_schema683._0_8_ + 0x38); puVar6 != puVar1;
            puVar6 = puVar6 + 1) {
          traverse((Node *)*puVar6,eagerness,seen,finalLoader,sourceInfo);
        }
        for (p_Var4 = *(_Rb_tree_node_base **)(uVar2 + 0x70);
            p_Var4 != (_Rb_tree_node_base *)(uVar2 + 0x60);
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          Alias::compile(&local_a0,(Alias *)p_Var4[1]._M_right);
          if ((local_a0.ptr.isSet == true) && (local_a0.ptr.field_1.value.tag - EXPANDED < 2)) {
            local_a0.ptr.field_1.value.tag = STUB;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Compiler::Node::traverse(uint eagerness, std::unordered_map<Node*, uint>& seen,
                              const SchemaLoader& finalLoader,
                              kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  uint& slot = seen[this];
  if ((slot & eagerness) == eagerness) {
    // We've already covered this node.
    return;
  }
  slot |= eagerness;

  KJ_IF_SOME(content, getContent(Content::FINISHED)) {
    loadFinalSchema(finalLoader);

    KJ_IF_SOME(schema, getFinalSchema()) {
      if (eagerness / DEPENDENCIES != 0) {
        // For traversing dependencies, discard the bits lower than DEPENDENCIES and replace
        // them with the bits above DEPENDENCIES shifted over.
        uint newEagerness = (eagerness & ~(DEPENDENCIES - 1)) | (eagerness / DEPENDENCIES);

        traverseNodeDependencies(schema, newEagerness, seen, finalLoader, sourceInfo);
        for (auto& aux: content.auxSchemas) {
          traverseNodeDependencies(aux, newEagerness, seen, finalLoader, sourceInfo);
        }
      }
    }

    sourceInfo.addAll(content.sourceInfo);
  }

  if (eagerness & PARENTS) {
    KJ_IF_SOME(p, parent) {
      p.traverse(eagerness, seen, finalLoader, sourceInfo);
    }
  }

  if (eagerness & CHILDREN) {
    KJ_IF_SOME(content, getContent(Content::EXPANDED)) {
      for (auto& child: content.orderedNestedNodes) {
        child->traverse(eagerness, seen, finalLoader, sourceInfo);
      }

      // Also traverse `using` declarations.
      for (auto& child: content.aliases) {
        child.second->compile();
      }
    }
  }
}